

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeImportCallCode(TranslateToFuzzReader *this,Type type)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  uint32_t uVar5;
  Expression *pEVar6;
  Const *pCVar7;
  Call *pCVar8;
  int x;
  bool bVar9;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  Expression *local_60;
  size_t local_58;
  undefined1 local_50 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  
  if ((type.id & 0xfffffffffffffffd) != 0) {
    __assert_fail("type == Type::none || type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x4f3,"Expression *wasm::TranslateToFuzzReader::makeImportCallCode(Type)");
  }
  bVar9 = type.id == 2;
  sVar1 = (&this->callExportImportName)[bVar9].super_IString.str._M_len;
  pcVar2 = (&this->callExportImportName)[bVar9].super_IString.str._M_str;
  pcVar3 = (&this->callRefImportName)[bVar9].super_IString.str._M_str;
  if (pcVar3 == (char *)0x0) {
LAB_00142f01:
    if (pcVar2 == (char *)0x0) {
      pEVar6 = makeTrivial(this,type);
      return pEVar6;
    }
  }
  else {
    local_58 = (&this->callRefImportName)[bVar9].super_IString.str._M_len;
    if (type.id != 2) {
      uVar5 = Random::upTo(&this->random,4);
      if (uVar5 == 0) goto LAB_00143007;
      goto LAB_00142f01;
    }
    if ((pcVar2 == (char *)0x0) || (uVar5 = Random::upTo(&this->random,2), uVar5 == 0)) {
LAB_00143007:
      uVar5 = Random::upTo(&this->random,10);
      local_60 = make(this,(Type)((ulong)(uVar5 == 0) * 2 + 0x10));
      __l_00._M_len = 1;
      __l_00._M_array = &local_60;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50,__l_00,
                 (allocator_type *)
                 ((long)&args.
                         super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (type.id != 2) {
        local_60 = make(this,(Type)0x2);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_50,&local_60
                  );
      }
      target_00.super_IString.str._M_str = pcVar3;
      target_00.super_IString.str._M_len = local_58;
      pCVar8 = Builder::makeCall(&this->builder,target_00,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 local_50,type,false);
      goto LAB_00143085;
    }
  }
  iVar4 = (int)((ulong)((long)(this->wasm->exports).
                              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->wasm->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  x = iVar4 * 2 + 2;
  if (type.id != 2) {
    x = iVar4;
  }
  local_58 = sVar1;
  pEVar6 = make(this,(Type)0x2);
  if ((this->allowOOB != true) ||
     (uVar5 = Random::upTo(&this->random,10), local_60 = pEVar6, uVar5 != 0)) {
    pCVar7 = Builder::makeConst<int>(&this->builder,x);
    local_60 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
    local_60->_id = BinaryId;
    (local_60->type).id = 0;
    *(undefined4 *)(local_60 + 1) = 6;
    local_60[1].type.id = (uintptr_t)pEVar6;
    *(Const **)(local_60 + 2) = pCVar7;
    wasm::Binary::finalize();
  }
  __l._M_len = 1;
  __l._M_array = &local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50,__l,
             (allocator_type *)
             ((long)&args.
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar1 = local_58;
  if (type.id != 2) {
    local_60 = make(this,(Type)0x2);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_50,&local_60);
  }
  target.super_IString.str._M_str = pcVar2;
  target.super_IString.str._M_len = sVar1;
  pCVar8 = Builder::makeCall(&this->builder,target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             local_50,type,false);
LAB_00143085:
  if (local_50 != (undefined1  [8])0x0) {
    operator_delete((void *)local_50,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_50);
  }
  return (Expression *)pCVar8;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportCallCode(Type type) {
  // Call code: either an export or a ref. Each has a catching and non-catching
  // variant. The catching variants return i32, the others none.
  assert(type == Type::none || type == Type::i32);
  auto catching = type == Type::i32;
  auto exportTarget =
    catching ? callExportCatchImportName : callExportImportName;
  auto refTarget = catching ? callRefCatchImportName : callRefImportName;

  // We want to call a ref less often, as refs are more likely to error (a
  // function reference can have arbitrary params and results, including things
  // that error on the JS boundary; an export is already filtered for such
  // things in some cases - when we legalize the boundary - and even if not, we
  // emit lots of void(void) functions - all the invoke_foo functions - that are
  // safe to call).
  if (refTarget) {
    // This matters a lot more in the variants that do *not* catch (in the
    // catching ones, we just get a result of 1, but when not caught it halts
    // execution).
    if ((catching && (!exportTarget || oneIn(2))) || (!catching && oneIn(4))) {
      // Most of the time make a non-nullable funcref, to avoid errors.
      auto refType = Type(HeapType::func, oneIn(10) ? Nullable : NonNullable);
      std::vector<Expression*> args = {make(refType)};
      if (!catching) {
        // Only the first bit matters here, so we can send anything (this is
        // future-proof for later bits, and has no downside now).
        args.push_back(make(Type::i32));
      }
      return builder.makeCall(refTarget, args, type);
    }
  }

  if (!exportTarget) {
    // We decided not to emit a call-ref here, due to fear of erroring, and
    // there is no call-export, so just emit something trivial.
    return makeTrivial(type);
  }

  // Pick the maximum export index to call.
  Index maxIndex = wasm.exports.size();
  if (type == Type::i32) {
    // This swallows errors, so we can be less careful, but we do still want to
    // avoid swallowing a lot as executing code is more interesting. (Note that
    // even though we double here, the risk is not that great: we are still
    // adding functions as we go, so the first half of functions/exports can
    // double here and still end up in bounds by the time we've added them all.)
    maxIndex = (maxIndex + 1) * 2;
  }

  // Most of the time, call a valid export index in the range we picked, but
  // sometimes allow anything at all.
  auto* index = make(Type::i32);
  if (!allowOOB || !oneIn(10)) {
    index = builder.makeBinary(
      RemUInt32, index, builder.makeConst(int32_t(maxIndex)));
  }

  // The non-catching variants send a flags argument, which says whether to
  // catch+rethrow.
  std::vector<Expression*> args = {index};
  if (!catching) {
    // Only the first bit matters here, so we can send anything (this is
    // future-proof for later bits, and has no downside now).
    args.push_back(make(Type::i32));
  }
  return builder.makeCall(exportTarget, args, type);
}